

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_bootstrap_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::anon_unknown_0::
CsharpBootstrapTest_GeneratedCsharpDescriptorMatches_Test::
~CsharpBootstrapTest_GeneratedCsharpDescriptorMatches_Test
          (CsharpBootstrapTest_GeneratedCsharpDescriptorMatches_Test *this)

{
  CsharpBootstrapTest_GeneratedCsharpDescriptorMatches_Test *this_local;
  
  ~CsharpBootstrapTest_GeneratedCsharpDescriptorMatches_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CsharpBootstrapTest, GeneratedCsharpDescriptorMatches) {
  // Skip this whole test if the csharp directory doesn't exist (i.e., a C++11
  // only distribution).
  std::string descriptor_file_name =
      "../csharp/src/Google.Protobuf/Reflection/Descriptor.cs";
  if (!File::Exists(absl::StrCat(TestSourceDir(), "/", descriptor_file_name))) {
    return;
  }

  MockErrorCollector error_collector;
  DiskSourceTree source_tree;
  Importer importer(&source_tree, &error_collector);
  GenerateAndTest generate_test;

  generate_test.SetParameter("base_namespace=Google.Protobuf");
  source_tree.MapPath("", TestSourceDir());
  generate_test.Run(importer.Import("google/protobuf/descriptor.proto"),
                    "Reflection/Descriptor.cs",
                    "../csharp/src/Google.Protobuf/Reflection/Descriptor.cs");
  generate_test.Run(importer.Import("google/protobuf/any.proto"),
                    "WellKnownTypes/Any.cs",
                    "../csharp/src/Google.Protobuf/WellKnownTypes/Any.cs");
  generate_test.Run(importer.Import("google/protobuf/api.proto"),
                    "WellKnownTypes/Api.cs",
                    "../csharp/src/Google.Protobuf/WellKnownTypes/Api.cs");
  generate_test.Run(importer.Import("google/protobuf/duration.proto"),
                    "WellKnownTypes/Duration.cs",
                    "../csharp/src/Google.Protobuf/WellKnownTypes/Duration.cs");
  generate_test.Run(importer.Import("google/protobuf/empty.proto"),
                    "WellKnownTypes/Empty.cs",
                    "../csharp/src/Google.Protobuf/WellKnownTypes/Empty.cs");
  generate_test.Run(importer.Import("google/protobuf/field_mask.proto"),
                    "WellKnownTypes/FieldMask.cs",
                    "../csharp/src/Google.Protobuf/WellKnownTypes/FieldMask.cs");
  generate_test.Run(importer.Import("google/protobuf/source_context.proto"),
                    "WellKnownTypes/SourceContext.cs",
                    "../csharp/src/Google.Protobuf/WellKnownTypes/SourceContext.cs");
  generate_test.Run(importer.Import("google/protobuf/struct.proto"),
                    "WellKnownTypes/Struct.cs",
                    "../csharp/src/Google.Protobuf/WellKnownTypes/Struct.cs");
  generate_test.Run(importer.Import("google/protobuf/timestamp.proto"),
                    "WellKnownTypes/Timestamp.cs",
                    "../csharp/src/Google.Protobuf/WellKnownTypes/Timestamp.cs");
  generate_test.Run(importer.Import("google/protobuf/type.proto"),
                    "WellKnownTypes/Type.cs",
                    "../csharp/src/Google.Protobuf/WellKnownTypes/Type.cs");
  generate_test.Run(importer.Import("google/protobuf/wrappers.proto"),
                    "WellKnownTypes/Wrappers.cs",
                    "../csharp/src/Google.Protobuf/WellKnownTypes/Wrappers.cs");

  EXPECT_EQ("", error_collector.text_);
}